

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformBufferBufferCase::testUniformBuffers
          (UniformBufferBufferCase *this)

{
  CallLogWrapper *this_00;
  GLint64 *pGVar1;
  bool bVar2;
  long lVar3;
  long offset;
  GLuint uniformIndices [2];
  StateQueryMemoryWriteGuard<int> state;
  GLuint buffers [2];
  char *uniformNames [2];
  BufferRequirements requirements [4];
  
  uniformIndices[0] = 0;
  uniformIndices[1] = 0;
  uniformNames[0] = "input1";
  uniformNames[1] = "input2";
  this_00 = &(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper;
  glu::CallLogWrapper::glGetUniformIndices
            (this_00,(this->super_UniformBufferCase).m_program,2,uniformNames,uniformIndices);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8a34,&state.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&state,(this->super_UniformBufferCase).super_ApiCase.super_TestCase.
                            super_TestCase.super_TestNode.m_testCtx);
  if (bVar2) {
    offset = (long)state.m_value;
    if (offset < 0x101) {
      if (state.m_value != -1) {
        requirements[0]._0_8_ =
             ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        pGVar1 = &requirements[0].value;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pGVar1);
        std::operator<<((ostream *)pGVar1,"Alignment is ");
        std::ostream::operator<<(pGVar1,state.m_value);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)requirements,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pGVar1);
        glu::CallLogWrapper::glGenBuffers(this_00,2,buffers);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,buffers[0]);
        glu::CallLogWrapper::glBufferData(this_00,0x8a11,0x20,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x8a11,uniformIndices[0],buffers[0]);
        ApiCase::expectError((ApiCase *)this,0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8a11,buffers[1]);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x8a11,(long)(state.m_value * 3 + 8),(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBufferRange
                  (this_00,0x8a11,uniformIndices[1],buffers[1],offset,(long)(state.m_value * 2));
        ApiCase::expectError((ApiCase *)this,0);
        requirements[0].pname = 0x8a29;
        requirements[0].index = uniformIndices[0];
        requirements[0].value = 0;
        requirements[1].index = uniformIndices[0];
        requirements[1].pname = 0x8a2a;
        requirements[1].value = 0;
        requirements[2].index = uniformIndices[1];
        requirements[2].pname = 0x8a29;
        requirements[3].index = uniformIndices[1];
        requirements[3].pname = 0x8a2a;
        requirements[2].value = offset;
        requirements[3].value = (long)(state.m_value * 2);
        for (lVar3 = 8; lVar3 != 0x48; lVar3 = lVar3 + 0x10) {
          deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
                    ((StateQueryMemoryWriteGuard<long> *)&state);
          glu::CallLogWrapper::glGetInteger64i_v
                    (this_00,*(GLenum *)((long)uniformNames + lVar3 + 0xc),
                     *(GLuint *)((long)uniformNames + lVar3 + 8),(GLint64 *)&state.m_postguard);
          bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                            ((StateQueryMemoryWriteGuard<long> *)&state,
                             (this->super_UniformBufferCase).super_ApiCase.super_TestCase.
                             super_TestCase.super_TestNode.m_testCtx);
          if (bVar2) {
            checkIntEquals((this->super_UniformBufferCase).super_ApiCase.super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx,stack0xfffffffffffffe20,
                           *(GLint64 *)((long)&requirements[0].index + lVar3));
          }
          ApiCase::expectError((ApiCase *)this,0);
        }
        glu::CallLogWrapper::glDeleteBuffers(this_00,2,buffers);
      }
    }
    else {
      requirements[0]._0_8_ =
           ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      pGVar1 = &requirements[0].value;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pGVar1);
      std::operator<<((ostream *)pGVar1,
                      "// ERROR: UNIFORM_BUFFER_OFFSET_ALIGNMENT has a maximum value of 256.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)requirements,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pGVar1);
      tcu::TestContext::setTestResult
                ((this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "invalid UNIFORM_BUFFER_OFFSET_ALIGNMENT value");
    }
  }
  return;
}

Assistant:

void testUniformBuffers (void)
	{
		const char* uniformNames[] =
		{
			"input1",
			"input2"
		};
		GLuint uniformIndices[2] = {0};
		glGetUniformIndices(m_program, 2, uniformNames, uniformIndices);

		const GLint alignment = GetAlignment();
		if (alignment == -1) // cannot continue without this
			return;

		m_testCtx.getLog() << tcu::TestLog::Message << "Alignment is " << alignment << tcu::TestLog::EndMessage;

		int rangeBufferOffset		= alignment;
		int rangeBufferSize			= alignment * 2;
		int rangeBufferTotalSize	= rangeBufferOffset + rangeBufferSize + 8; // + 8 has no special meaning, just to make it != with the size of the range

		GLuint buffers[2];
		glGenBuffers(2, buffers);

		glBindBuffer(GL_UNIFORM_BUFFER, buffers[0]);
		glBufferData(GL_UNIFORM_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
		glBindBufferBase(GL_UNIFORM_BUFFER, uniformIndices[0], buffers[0]);
		expectError(GL_NO_ERROR);

		glBindBuffer(GL_UNIFORM_BUFFER, buffers[1]);
		glBufferData(GL_UNIFORM_BUFFER, rangeBufferTotalSize, DE_NULL, GL_DYNAMIC_DRAW);
		glBindBufferRange(GL_UNIFORM_BUFFER, uniformIndices[1], buffers[1], rangeBufferOffset, rangeBufferSize);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE

		const struct BufferRequirements
		{
			GLuint	index;
			GLenum	pname;
			GLint64 value;
		} requirements[] =
		{
			{ uniformIndices[0], GL_UNIFORM_BUFFER_START,	0					},
			{ uniformIndices[0], GL_UNIFORM_BUFFER_SIZE,	0					},
			{ uniformIndices[1], GL_UNIFORM_BUFFER_START,	rangeBufferOffset	},
			{ uniformIndices[1], GL_UNIFORM_BUFFER_SIZE,	rangeBufferSize		}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requirements); ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint64> state;
			glGetInteger64i_v(requirements[ndx].pname, requirements[ndx].index, &state);

			if (state.verifyValidity(m_testCtx))
				checkIntEquals(m_testCtx, state, requirements[ndx].value);
			expectError(GL_NO_ERROR);
		}

		glDeleteBuffers(2, buffers);
	}